

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::Bound_Function::Bound_Function
          (Bound_Function *this,Const_Proxy_Function *t_f,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_args)

{
  int iVar1;
  element_type *this_00;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_RDI;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *in_stack_00000040;
  Const_Proxy_Function *in_stack_00000048;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  Proxy_Function_Base *in_stack_ffffffffffffffb0;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_48;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_ffffffffffffffd8;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_ffffffffffffffe0;
  
  build_param_type_info(in_stack_00000048,in_stack_00000040);
  this_00 = std::
            __shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3b452b);
  iVar1 = Proxy_Function_Base::get_arity(this_00);
  in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 & 0xffffff;
  if (-1 < iVar1) {
    build_param_type_info(in_stack_00000048,in_stack_00000040);
    in_stack_ffffffffffffffa8 = CONCAT13(1,(int3)in_stack_ffffffffffffffa8);
    std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size(&local_48);
  }
  Proxy_Function_Base::Proxy_Function_Base
            (in_stack_ffffffffffffffb0,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (int)((ulong)in_RDI >> 0x20));
  if ((in_stack_ffffffffffffffa8 & 0x1000000) != 0) {
    std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector(in_RDI);
  }
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector(in_RDI);
  (in_RDI->super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Bound_Function_005c8e80;
  std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>::shared_ptr
            ((shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)
             &in_RDI[1].
              super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,in_stack_ffffffffffffff88);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

Bound_Function(const Const_Proxy_Function &t_f, 
            const std::vector<Boxed_Value> &t_args)
          : Proxy_Function_Base(build_param_type_info(t_f, t_args), (t_f->get_arity()<0?-1:static_cast<int>(build_param_type_info(t_f, t_args).size())-1)),
            m_f(t_f), m_args(t_args)
        {
          assert(m_f->get_arity() < 0 || m_f->get_arity() == static_cast<int>(m_args.size()));
        }